

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BBox1f BVar1;
  float fVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  size_t k;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  int iVar54;
  AABBNodeMB4D *node1;
  byte bVar55;
  long lVar56;
  undefined1 (*pauVar57) [32];
  NodeRef root;
  ulong uVar58;
  byte bVar59;
  ulong uVar60;
  ulong uVar61;
  uint uVar62;
  vuint<4> *v;
  ulong *puVar63;
  uint uVar64;
  byte bVar65;
  undefined4 uVar66;
  bool bVar67;
  ulong uVar68;
  ulong uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar95;
  float fVar96;
  float fVar100;
  undefined1 auVar97 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  undefined1 auVar109 [32];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 in_ZMM2 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [64];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [64];
  float fVar134;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [64];
  float fVar143;
  undefined1 auVar144 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [64];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 in_ZMM11 [64];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 in_ZMM12 [64];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 in_ZMM13 [64];
  undefined1 auVar188 [36];
  undefined1 in_ZMM14 [64];
  undefined1 auVar189 [28];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  Precalculations pre;
  vuint<4> *v_1;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5da2;
  Precalculations local_5d71;
  ulong local_5d70;
  undefined4 local_5d64;
  undefined1 local_5d60 [32];
  RayK<8> *local_5d28;
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined8 local_5ce0;
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  float local_5cc0 [4];
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  BVH *local_5ca0;
  Intersectors *local_5c98;
  ulong local_5c90;
  ulong local_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 local_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  undefined1 local_5c00 [32];
  float local_5be0;
  float fStack_5bdc;
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  undefined4 uStack_5bc4;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  int local_5b40;
  int iStack_5b3c;
  int iStack_5b38;
  int iStack_5b34;
  int iStack_5b30;
  int iStack_5b2c;
  int iStack_5b28;
  int iStack_5b24;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b20;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  undefined4 uStack_59e4;
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  undefined4 uStack_59c4;
  undefined1 local_59c0 [32];
  int local_59a0;
  int iStack_599c;
  int iStack_5998;
  int iStack_5994;
  int iStack_5990;
  int iStack_598c;
  int iStack_5988;
  int iStack_5984;
  uint local_5980;
  uint uStack_597c;
  uint uStack_5978;
  uint uStack_5974;
  uint uStack_5970;
  uint uStack_596c;
  uint uStack_5968;
  uint uStack_5964;
  uint local_5960;
  uint uStack_595c;
  uint uStack_5958;
  uint uStack_5954;
  uint uStack_5950;
  uint uStack_594c;
  uint uStack_5948;
  uint uStack_5944;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [8];
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  undefined1 local_5840 [8];
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    auVar75 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar70 = ZEXT816(0) << 0x40;
    uVar68 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar70),5);
    uVar60 = vpcmpeqd_avx512vl(auVar75,(undefined1  [32])valid_i->field_0);
    uVar68 = uVar68 & uVar60;
    bVar59 = (byte)uVar68;
    if (bVar59 != 0) {
      local_5b20._0_4_ = *(float *)ray;
      local_5b20._4_4_ = *(float *)(ray + 4);
      local_5b20._8_4_ = *(float *)(ray + 8);
      local_5b20._12_4_ = *(float *)(ray + 0xc);
      local_5b20._16_4_ = *(float *)(ray + 0x10);
      local_5b20._20_4_ = *(float *)(ray + 0x14);
      local_5b20._24_4_ = *(float *)(ray + 0x18);
      local_5b20._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5b20._32_4_ = *(float *)(ray + 0x20);
      local_5b20._36_4_ = *(float *)(ray + 0x24);
      local_5b20._40_4_ = *(float *)(ray + 0x28);
      local_5b20._44_4_ = *(float *)(ray + 0x2c);
      local_5b20._48_4_ = *(float *)(ray + 0x30);
      local_5b20._52_4_ = *(float *)(ray + 0x34);
      local_5b20._56_4_ = *(float *)(ray + 0x38);
      local_5b20._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5b20._64_4_ = *(float *)(ray + 0x40);
      local_5b20._68_4_ = *(float *)(ray + 0x44);
      local_5b20._72_4_ = *(float *)(ray + 0x48);
      local_5b20._76_4_ = *(float *)(ray + 0x4c);
      local_5b20._80_4_ = *(float *)(ray + 0x50);
      local_5b20._84_4_ = *(float *)(ray + 0x54);
      local_5b20._88_4_ = *(float *)(ray + 0x58);
      local_5b20._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_5ac0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5aa0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5a80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar72._16_4_ = 0x7fffffff;
      auVar72._20_4_ = 0x7fffffff;
      auVar72._24_4_ = 0x7fffffff;
      auVar72._28_4_ = 0x7fffffff;
      auVar160 = ZEXT3264(auVar72);
      auVar75 = vandps_avx(auVar72,local_5ac0);
      auVar71._8_4_ = 0x219392ef;
      auVar71._0_8_ = 0x219392ef219392ef;
      auVar71._12_4_ = 0x219392ef;
      auVar71._16_4_ = 0x219392ef;
      auVar71._20_4_ = 0x219392ef;
      auVar71._24_4_ = 0x219392ef;
      auVar71._28_4_ = 0x219392ef;
      auVar158 = ZEXT3264(auVar71);
      uVar60 = vcmpps_avx512vl(auVar75,auVar71,1);
      bVar67 = (bool)((byte)uVar60 & 1);
      auVar73._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._0_4_;
      bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._4_4_;
      bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._8_4_;
      bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._12_4_;
      bVar67 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._16_4_;
      bVar67 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._20_4_;
      bVar67 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._24_4_;
      bVar67 = SUB81(uVar60 >> 7,0);
      auVar73._28_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5ac0._28_4_;
      auVar75 = vandps_avx(auVar72,local_5aa0);
      uVar60 = vcmpps_avx512vl(auVar75,auVar71,1);
      bVar67 = (bool)((byte)uVar60 & 1);
      auVar74._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._0_4_;
      bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._4_4_;
      bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._8_4_;
      bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._12_4_;
      bVar67 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar74._16_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._16_4_;
      bVar67 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar74._20_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._20_4_;
      bVar67 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar74._24_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._24_4_;
      bVar67 = SUB81(uVar60 >> 7,0);
      auVar74._28_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5aa0._28_4_;
      auVar75 = vandps_avx(auVar72,local_5a80);
      uVar60 = vcmpps_avx512vl(auVar75,auVar71,1);
      bVar67 = (bool)((byte)uVar60 & 1);
      auVar75._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._0_4_;
      bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar75._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._4_4_;
      bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar75._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._8_4_;
      bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar75._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._12_4_;
      bVar67 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar75._16_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._16_4_;
      bVar67 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar75._20_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._20_4_;
      bVar67 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar75._24_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._24_4_;
      bVar67 = SUB81(uVar60 >> 7,0);
      auVar75._28_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * local_5a80._28_4_;
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar191 = ZEXT3264(auVar71);
      auVar72 = vrcp14ps_avx512vl(auVar73);
      auVar73 = vfnmadd213ps_avx512vl(auVar73,auVar72,auVar71);
      auVar97 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
      auVar127 = ZEXT1664(auVar97);
      auVar73 = vrcp14ps_avx512vl(auVar74);
      auVar74 = vfnmadd213ps_avx512vl(auVar74,auVar73,auVar71);
      auVar105 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
      auVar136 = ZEXT1664(auVar105);
      auVar73 = vrcp14ps_avx512vl(auVar75);
      auVar155 = ZEXT3264(auVar73);
      auVar75 = vfnmadd213ps_avx512vl(auVar75,auVar73,auVar71);
      local_5a60 = ZEXT1632(auVar97);
      local_5a40 = ZEXT1632(auVar105);
      auVar23 = vfmadd132ps_fma(auVar75,auVar73,auVar73);
      auVar145 = ZEXT1664(auVar23);
      local_5a20 = ZEXT1632(auVar23);
      local_59c0._4_4_ = *(float *)(ray + 0x44) * auVar23._4_4_;
      local_59c0._0_4_ = *(float *)(ray + 0x40) * auVar23._0_4_;
      local_59c0._8_4_ = *(float *)(ray + 0x48) * auVar23._8_4_;
      local_59c0._12_4_ = *(float *)(ray + 0x4c) * auVar23._12_4_;
      local_59c0._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_59c0._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_59c0._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_59c0._28_4_ = *(undefined4 *)(ray + 0x5c);
      auVar119 = ZEXT3264(local_59c0);
      local_5a00 = *(float *)ray * auVar97._0_4_;
      fStack_59fc = *(float *)(ray + 4) * auVar97._4_4_;
      fStack_59f8 = *(float *)(ray + 8) * auVar97._8_4_;
      fStack_59f4 = *(float *)(ray + 0xc) * auVar97._12_4_;
      fStack_59f0 = *(float *)(ray + 0x10) * 0.0;
      fStack_59ec = *(float *)(ray + 0x14) * 0.0;
      fStack_59e8 = *(float *)(ray + 0x18) * 0.0;
      uStack_59e4 = *(undefined4 *)(ray + 0x1c);
      local_59e0 = *(float *)(ray + 0x20) * auVar105._0_4_;
      fStack_59dc = *(float *)(ray + 0x24) * auVar105._4_4_;
      fStack_59d8 = *(float *)(ray + 0x28) * auVar105._8_4_;
      fStack_59d4 = *(float *)(ray + 0x2c) * auVar105._12_4_;
      fStack_59d0 = *(float *)(ray + 0x30) * 0.0;
      fStack_59cc = *(float *)(ray + 0x34) * 0.0;
      fStack_59c8 = *(float *)(ray + 0x38) * 0.0;
      uStack_59c4 = *(undefined4 *)(ray + 0x3c);
      uVar60 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar70),1);
      auVar75 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_59a0 = (uint)((byte)uVar60 & 1) * auVar75._0_4_;
      iStack_599c = (uint)((byte)(uVar60 >> 1) & 1) * auVar75._4_4_;
      iStack_5998 = (uint)((byte)(uVar60 >> 2) & 1) * auVar75._8_4_;
      iStack_5994 = (uint)((byte)(uVar60 >> 3) & 1) * auVar75._12_4_;
      iStack_5990 = (uint)((byte)(uVar60 >> 4) & 1) * auVar75._16_4_;
      iStack_598c = (uint)((byte)(uVar60 >> 5) & 1) * auVar75._20_4_;
      iStack_5988 = (uint)((byte)(uVar60 >> 6) & 1) * auVar75._24_4_;
      iStack_5984 = (uint)(byte)(uVar60 >> 7) * auVar75._28_4_;
      auVar73 = ZEXT1632(auVar70);
      uVar60 = vcmpps_avx512vl(ZEXT1632(auVar105),auVar73,5);
      auVar75 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar67 = (bool)((byte)uVar60 & 1);
      bVar8 = (bool)((byte)(uVar60 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
      bVar14 = SUB81(uVar60 >> 7,0);
      local_5980 = (uint)bVar67 * auVar75._0_4_ | (uint)!bVar67 * 0x60;
      uStack_597c = (uint)bVar8 * auVar75._4_4_ | (uint)!bVar8 * 0x60;
      uStack_5978 = (uint)bVar9 * auVar75._8_4_ | (uint)!bVar9 * 0x60;
      uStack_5974 = (uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * 0x60;
      uStack_5970 = (uint)bVar11 * auVar75._16_4_ | (uint)!bVar11 * 0x60;
      uStack_596c = (uint)bVar12 * auVar75._20_4_ | (uint)!bVar12 * 0x60;
      uStack_5968 = (uint)bVar13 * auVar75._24_4_ | (uint)!bVar13 * 0x60;
      uStack_5964 = (uint)bVar14 * auVar75._28_4_ | (uint)!bVar14 * 0x60;
      uVar60 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar73,5);
      auVar75 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar67 = (bool)((byte)uVar60 & 1);
      bVar8 = (bool)((byte)(uVar60 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
      bVar14 = SUB81(uVar60 >> 7,0);
      local_5960 = (uint)bVar67 * auVar75._0_4_ | (uint)!bVar67 * 0xa0;
      uStack_595c = (uint)bVar8 * auVar75._4_4_ | (uint)!bVar8 * 0xa0;
      uStack_5958 = (uint)bVar9 * auVar75._8_4_ | (uint)!bVar9 * 0xa0;
      uStack_5954 = (uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * 0xa0;
      uStack_5950 = (uint)bVar11 * auVar75._16_4_ | (uint)!bVar11 * 0xa0;
      uStack_594c = (uint)bVar12 * auVar75._20_4_ | (uint)!bVar12 * 0xa0;
      uStack_5948 = (uint)bVar13 * auVar75._24_4_ | (uint)!bVar13 * 0xa0;
      uStack_5944 = (uint)bVar14 * auVar75._28_4_ | (uint)!bVar14 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar192 = ZEXT3264(local_4680);
      local_5d64 = (undefined4)uVar68;
      auVar75 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar73);
      local_5940._0_4_ =
           (uint)(bVar59 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * local_4680._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      local_5940._4_4_ = (uint)bVar67 * auVar75._4_4_ | (uint)!bVar67 * local_4680._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      local_5940._8_4_ = (uint)bVar67 * auVar75._8_4_ | (uint)!bVar67 * local_4680._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      local_5940._12_4_ = (uint)bVar67 * auVar75._12_4_ | (uint)!bVar67 * local_4680._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      local_5940._16_4_ = (uint)bVar67 * auVar75._16_4_ | (uint)!bVar67 * local_4680._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      local_5940._20_4_ = (uint)bVar67 * auVar75._20_4_ | (uint)!bVar67 * local_4680._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      local_5940._24_4_ = (uint)bVar67 * auVar75._24_4_ | (uint)!bVar67 * local_4680._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      local_5940._28_4_ = (uint)bVar67 * auVar75._28_4_ | (uint)!bVar67 * local_4680._28_4_;
      auVar75 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar73);
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar68 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
      bVar13 = SUB81(uVar68 >> 7,0);
      local_5920._4_4_ = (uint)bVar67 * auVar75._4_4_ | (uint)!bVar67 * -0x800000;
      local_5920._0_4_ = (uint)(bVar59 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * -0x800000;
      local_5920._8_4_ = (uint)bVar8 * auVar75._8_4_ | (uint)!bVar8 * -0x800000;
      local_5920._12_4_ = (uint)bVar9 * auVar75._12_4_ | (uint)!bVar9 * -0x800000;
      local_5920._16_4_ = (uint)bVar10 * auVar75._16_4_ | (uint)!bVar10 * -0x800000;
      local_5920._20_4_ = (uint)bVar11 * auVar75._20_4_ | (uint)!bVar11 * -0x800000;
      local_5920._24_4_ = (uint)bVar12 * auVar75._24_4_ | (uint)!bVar12 * -0x800000;
      local_5920._28_4_ = (uint)bVar13 * auVar75._28_4_ | (uint)!bVar13 * -0x800000;
      bVar59 = ~bVar59;
      local_5c98 = This;
      local_5ca0 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar62 = 7;
      }
      else {
        uVar62 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5d28 = ray + 0x100;
      puVar63 = local_5800;
      pauVar57 = (undefined1 (*) [32])local_4640;
      local_5810 = 0xfffffffffffffff8;
      local_4660 = local_5940;
      auVar70 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar193 = ZEXT1664(auVar70);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar194 = ZEXT3264(auVar75);
LAB_01f5a4b4:
      do {
        do {
          root.ptr = puVar63[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5b248;
          puVar63 = puVar63 + -1;
          pauVar57 = pauVar57 + -1;
          auVar75 = *pauVar57;
          auVar190 = ZEXT3264(auVar75);
          uVar68 = vcmpps_avx512vl(auVar75,local_5920,1);
        } while ((char)uVar68 == '\0');
        uVar66 = (undefined4)uVar68;
        if (uVar62 < (uint)POPCOUNT(uVar66)) {
LAB_01f5a4f6:
          do {
            uVar64 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5b248;
              uVar20 = vcmpps_avx512vl(auVar190._0_32_,local_5920,9);
              if ((char)uVar20 != '\0') {
                local_5c90 = (ulong)(uVar64 & 0xf) - 8;
                bVar65 = bVar59;
                if (local_5c90 != 0) {
                  local_5da2 = ~bVar59;
                  uVar68 = 0;
                  do {
                    local_5c88 = uVar68;
                    lVar56 = uVar68 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    uVar68 = 0;
                    local_5d70 = (ulong)local_5da2;
                    for (uVar60 = local_5d70; (uVar60 & 1) == 0;
                        uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                      uVar68 = uVar68 + 1;
                    }
                    local_5d60._0_8_ = lVar56;
                    uVar60 = 0;
                    bVar65 = local_5da2;
                    while( true ) {
                      auVar188 = in_ZMM13._28_36_;
                      auVar153 = auVar155._0_32_;
                      auVar157 = auVar158._0_32_;
                      auVar189 = auVar190._0_28_;
                      if (*(int *)(lVar56 + 0x40 + uVar60 * 4) == -1) break;
                      pRVar3 = (context->scene->geometries).items;
                      pGVar4 = pRVar3[*(uint *)(lVar56 + 0x30 + uVar60 * 4)].ptr;
                      BVar1 = pGVar4->time_range;
                      auVar97._8_8_ = 0;
                      auVar97._0_4_ = BVar1.lower;
                      auVar97._4_4_ = BVar1.upper;
                      fVar96 = pGVar4->fnumTimeSegments;
                      auVar105._4_4_ = fVar96;
                      auVar105._0_4_ = fVar96;
                      auVar105._8_4_ = fVar96;
                      auVar105._12_4_ = fVar96;
                      fVar95 = BVar1.lower;
                      auVar109._4_4_ = fVar95;
                      auVar109._0_4_ = fVar95;
                      auVar109._8_4_ = fVar95;
                      auVar109._12_4_ = fVar95;
                      auVar109._16_4_ = fVar95;
                      auVar109._20_4_ = fVar95;
                      auVar109._24_4_ = fVar95;
                      auVar109._28_4_ = fVar95;
                      auVar75 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar109);
                      auVar70 = vmovshdup_avx(auVar97);
                      auVar116 = ZEXT1632(auVar70);
                      auVar70 = vsubps_avx(auVar70,auVar97);
                      auVar98._0_4_ = auVar70._0_4_;
                      auVar98._4_4_ = auVar98._0_4_;
                      auVar98._8_4_ = auVar98._0_4_;
                      auVar98._12_4_ = auVar98._0_4_;
                      auVar98._16_4_ = auVar98._0_4_;
                      auVar98._20_4_ = auVar98._0_4_;
                      auVar98._24_4_ = auVar98._0_4_;
                      auVar98._28_4_ = auVar98._0_4_;
                      auVar75 = vdivps_avx(auVar75,auVar98);
                      auVar47._4_4_ = fVar96 * auVar75._4_4_;
                      auVar47._0_4_ = fVar96 * auVar75._0_4_;
                      auVar47._8_4_ = fVar96 * auVar75._8_4_;
                      auVar47._12_4_ = fVar96 * auVar75._12_4_;
                      auVar47._16_4_ = fVar96 * auVar75._16_4_;
                      auVar47._20_4_ = fVar96 * auVar75._20_4_;
                      auVar47._24_4_ = fVar96 * auVar75._24_4_;
                      auVar47._28_4_ = auVar75._28_4_;
                      auVar75 = vroundps_avx(auVar47,1);
                      auVar70 = vaddss_avx512f(auVar105,SUB6416(ZEXT464(0xbf800000),0));
                      auVar106._0_4_ = auVar70._0_4_;
                      auVar106._4_4_ = auVar106._0_4_;
                      auVar106._8_4_ = auVar106._0_4_;
                      auVar106._12_4_ = auVar106._0_4_;
                      auVar106._16_4_ = auVar106._0_4_;
                      auVar106._20_4_ = auVar106._0_4_;
                      auVar106._24_4_ = auVar106._0_4_;
                      auVar106._28_4_ = auVar106._0_4_;
                      auVar75 = vminps_avx(auVar75,auVar106);
                      auVar74 = auVar193._0_32_;
                      auVar75 = vmaxps_avx512vl(auVar75,auVar74);
                      local_5d20 = vcvtps2dq_avx(auVar75);
                      auVar75 = vsubps_avx(auVar47,auVar75);
                      auVar80 = vpbroadcastd_avx512vl();
                      uVar20 = vpcmpeqd_avx512vl(auVar80,local_5d20);
                      auVar73 = auVar191._0_32_;
                      if ((byte)((byte)uVar20 | ~local_5da2) == 0xff) {
                        lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives +
                                         (long)*(int *)(local_5d20 + uVar68 * 4) * 0x38);
                        lVar6 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 +
                                         (long)*(int *)(local_5d20 + uVar68 * 4) * 0x38);
                        uVar69 = (ulong)*(uint *)(lVar56 + uVar60 * 4);
                        uVar61 = (ulong)*(uint *)(lVar56 + 0x10 + uVar60 * 4);
                        auVar71 = vsubps_avx512vl(auVar73,auVar75);
                        uVar66 = *(undefined4 *)(lVar6 + uVar69 * 4);
                        auVar28._4_4_ = uVar66;
                        auVar28._0_4_ = uVar66;
                        auVar28._8_4_ = uVar66;
                        auVar28._12_4_ = uVar66;
                        auVar28._16_4_ = uVar66;
                        auVar28._20_4_ = uVar66;
                        auVar28._24_4_ = uVar66;
                        auVar28._28_4_ = uVar66;
                        auVar72 = vmulps_avx512vl(auVar75,auVar28);
                        uVar66 = *(undefined4 *)(lVar6 + 4 + uVar69 * 4);
                        auVar29._4_4_ = uVar66;
                        auVar29._0_4_ = uVar66;
                        auVar29._8_4_ = uVar66;
                        auVar29._12_4_ = uVar66;
                        auVar29._16_4_ = uVar66;
                        auVar29._20_4_ = uVar66;
                        auVar29._24_4_ = uVar66;
                        auVar29._28_4_ = uVar66;
                        auVar76 = vmulps_avx512vl(auVar75,auVar29);
                        uVar66 = *(undefined4 *)(lVar6 + 8 + uVar69 * 4);
                        auVar30._4_4_ = uVar66;
                        auVar30._0_4_ = uVar66;
                        auVar30._8_4_ = uVar66;
                        auVar30._12_4_ = uVar66;
                        auVar30._16_4_ = uVar66;
                        auVar30._20_4_ = uVar66;
                        auVar30._24_4_ = uVar66;
                        auVar30._28_4_ = uVar66;
                        auVar77 = vmulps_avx512vl(auVar75,auVar30);
                        uVar66 = *(undefined4 *)(lVar5 + uVar69 * 4);
                        auVar31._4_4_ = uVar66;
                        auVar31._0_4_ = uVar66;
                        auVar31._8_4_ = uVar66;
                        auVar31._12_4_ = uVar66;
                        auVar31._16_4_ = uVar66;
                        auVar31._20_4_ = uVar66;
                        auVar31._24_4_ = uVar66;
                        auVar31._28_4_ = uVar66;
                        auVar81 = vfmadd231ps_avx512vl(auVar72,auVar71,auVar31);
                        uVar66 = *(undefined4 *)(lVar5 + 4 + uVar69 * 4);
                        auVar32._4_4_ = uVar66;
                        auVar32._0_4_ = uVar66;
                        auVar32._8_4_ = uVar66;
                        auVar32._12_4_ = uVar66;
                        auVar32._16_4_ = uVar66;
                        auVar32._20_4_ = uVar66;
                        auVar32._24_4_ = uVar66;
                        auVar32._28_4_ = uVar66;
                        auVar82 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar32);
                        uVar66 = *(undefined4 *)(lVar5 + 8 + uVar69 * 4);
                        auVar33._4_4_ = uVar66;
                        auVar33._0_4_ = uVar66;
                        auVar33._8_4_ = uVar66;
                        auVar33._12_4_ = uVar66;
                        auVar33._16_4_ = uVar66;
                        auVar33._20_4_ = uVar66;
                        auVar33._24_4_ = uVar66;
                        auVar33._28_4_ = uVar66;
                        auVar83 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar33);
                        uVar66 = *(undefined4 *)(lVar6 + uVar61 * 4);
                        auVar34._4_4_ = uVar66;
                        auVar34._0_4_ = uVar66;
                        auVar34._8_4_ = uVar66;
                        auVar34._12_4_ = uVar66;
                        auVar34._16_4_ = uVar66;
                        auVar34._20_4_ = uVar66;
                        auVar34._24_4_ = uVar66;
                        auVar34._28_4_ = uVar66;
                        auVar72 = vmulps_avx512vl(auVar75,auVar34);
                        uVar66 = *(undefined4 *)(lVar6 + 4 + uVar61 * 4);
                        auVar35._4_4_ = uVar66;
                        auVar35._0_4_ = uVar66;
                        auVar35._8_4_ = uVar66;
                        auVar35._12_4_ = uVar66;
                        auVar35._16_4_ = uVar66;
                        auVar35._20_4_ = uVar66;
                        auVar35._24_4_ = uVar66;
                        auVar35._28_4_ = uVar66;
                        auVar76 = vmulps_avx512vl(auVar75,auVar35);
                        uVar66 = *(undefined4 *)(lVar6 + 8 + uVar61 * 4);
                        auVar36._4_4_ = uVar66;
                        auVar36._0_4_ = uVar66;
                        auVar36._8_4_ = uVar66;
                        auVar36._12_4_ = uVar66;
                        auVar36._16_4_ = uVar66;
                        auVar36._20_4_ = uVar66;
                        auVar36._24_4_ = uVar66;
                        auVar36._28_4_ = uVar66;
                        auVar77 = vmulps_avx512vl(auVar75,auVar36);
                        uVar66 = *(undefined4 *)(lVar5 + uVar61 * 4);
                        auVar37._4_4_ = uVar66;
                        auVar37._0_4_ = uVar66;
                        auVar37._8_4_ = uVar66;
                        auVar37._12_4_ = uVar66;
                        auVar37._16_4_ = uVar66;
                        auVar37._20_4_ = uVar66;
                        auVar37._24_4_ = uVar66;
                        auVar37._28_4_ = uVar66;
                        auVar84 = vfmadd231ps_avx512vl(auVar72,auVar71,auVar37);
                        uVar66 = *(undefined4 *)(lVar5 + 4 + uVar61 * 4);
                        auVar38._4_4_ = uVar66;
                        auVar38._0_4_ = uVar66;
                        auVar38._8_4_ = uVar66;
                        auVar38._12_4_ = uVar66;
                        auVar38._16_4_ = uVar66;
                        auVar38._20_4_ = uVar66;
                        auVar38._24_4_ = uVar66;
                        auVar38._28_4_ = uVar66;
                        auVar85 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar38);
                        uVar66 = *(undefined4 *)(lVar5 + 8 + uVar61 * 4);
                        auVar39._4_4_ = uVar66;
                        auVar39._0_4_ = uVar66;
                        auVar39._8_4_ = uVar66;
                        auVar39._12_4_ = uVar66;
                        auVar39._16_4_ = uVar66;
                        auVar39._20_4_ = uVar66;
                        auVar39._24_4_ = uVar66;
                        auVar39._28_4_ = uVar66;
                        auVar86 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar39);
                        uVar69 = (ulong)*(uint *)(lVar56 + 0x20 + uVar60 * 4);
                        uVar66 = *(undefined4 *)(lVar6 + uVar69 * 4);
                        auVar40._4_4_ = uVar66;
                        auVar40._0_4_ = uVar66;
                        auVar40._8_4_ = uVar66;
                        auVar40._12_4_ = uVar66;
                        auVar40._16_4_ = uVar66;
                        auVar40._20_4_ = uVar66;
                        auVar40._24_4_ = uVar66;
                        auVar40._28_4_ = uVar66;
                        auVar72 = vmulps_avx512vl(auVar75,auVar40);
                        uVar66 = *(undefined4 *)(lVar6 + 4 + uVar69 * 4);
                        auVar41._4_4_ = uVar66;
                        auVar41._0_4_ = uVar66;
                        auVar41._8_4_ = uVar66;
                        auVar41._12_4_ = uVar66;
                        auVar41._16_4_ = uVar66;
                        auVar41._20_4_ = uVar66;
                        auVar41._24_4_ = uVar66;
                        auVar41._28_4_ = uVar66;
                        auVar76 = vmulps_avx512vl(auVar75,auVar41);
                        uVar66 = *(undefined4 *)(lVar6 + 8 + uVar69 * 4);
                        auVar42._4_4_ = uVar66;
                        auVar42._0_4_ = uVar66;
                        auVar42._8_4_ = uVar66;
                        auVar42._12_4_ = uVar66;
                        auVar42._16_4_ = uVar66;
                        auVar42._20_4_ = uVar66;
                        auVar42._24_4_ = uVar66;
                        auVar42._28_4_ = uVar66;
                        auVar75 = vmulps_avx512vl(auVar75,auVar42);
                        uVar66 = *(undefined4 *)(lVar5 + uVar69 * 4);
                        auVar43._4_4_ = uVar66;
                        auVar43._0_4_ = uVar66;
                        auVar43._8_4_ = uVar66;
                        auVar43._12_4_ = uVar66;
                        auVar43._16_4_ = uVar66;
                        auVar43._20_4_ = uVar66;
                        auVar43._24_4_ = uVar66;
                        auVar43._28_4_ = uVar66;
                        auVar87 = vfmadd231ps_avx512vl(auVar72,auVar71,auVar43);
                        uVar66 = *(undefined4 *)(lVar5 + 4 + uVar69 * 4);
                        auVar44._4_4_ = uVar66;
                        auVar44._0_4_ = uVar66;
                        auVar44._8_4_ = uVar66;
                        auVar44._12_4_ = uVar66;
                        auVar44._16_4_ = uVar66;
                        auVar44._20_4_ = uVar66;
                        auVar44._24_4_ = uVar66;
                        auVar44._28_4_ = uVar66;
                        auVar88 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar44);
                        uVar66 = *(undefined4 *)(lVar5 + 8 + uVar69 * 4);
                        auVar45._4_4_ = uVar66;
                        auVar45._0_4_ = uVar66;
                        auVar45._8_4_ = uVar66;
                        auVar45._12_4_ = uVar66;
                        auVar45._16_4_ = uVar66;
                        auVar45._20_4_ = uVar66;
                        auVar45._24_4_ = uVar66;
                        auVar45._28_4_ = uVar66;
                        auVar89 = vfmadd231ps_avx512vl(auVar75,auVar71,auVar45);
                      }
                      else {
                        if (local_5da2 != 0) {
                          lVar56 = *(long *)&pGVar4[2].numPrimitives;
                          uVar58 = (ulong)*(uint *)(local_5d60._0_8_ + uVar60 * 4);
                          uVar61 = local_5d70;
                          uVar69 = uVar68;
                          do {
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + (long)*(int *)(local_5d20 + uVar69 * 4) *
                                                           0x38) + uVar58 * 4);
                            auVar97 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar69 * 4) * 0x38) +
                                       uVar58 * 4);
                            *(int *)((long)&local_5c60 + uVar69 * 4) = auVar70._0_4_;
                            uVar66 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&local_5c40 + uVar69 * 4) = uVar66;
                            uVar66 = vextractps_avx(auVar70,2);
                            *(undefined4 *)(local_5c20 + uVar69 * 4) = uVar66;
                            *(int *)(local_5d00 + uVar69 * 4) = auVar97._0_4_;
                            uVar66 = vextractps_avx(auVar97,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar69 * 4) = uVar66;
                            fVar96 = (float)vextractps_avx(auVar97,2);
                            local_5cc0[uVar69] = fVar96;
                            uVar61 = uVar61 ^ 1L << (uVar69 & 0x3f);
                            uVar69 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar69 = uVar69 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar116._8_8_ = uStack_5c58;
                          auVar116._0_8_ = local_5c60;
                          auVar116._16_8_ = uStack_5c50;
                          auVar116._24_8_ = uStack_5c48;
                          auVar80._8_8_ = local_5d00._8_8_;
                          auVar80._0_8_ = local_5d00._0_8_;
                          auVar80._16_8_ = local_5d00._16_8_;
                          auVar80._24_8_ = local_5d00._24_8_;
                        }
                        auVar71 = vsubps_avx512vl(auVar73,auVar75);
                        fVar108 = auVar71._0_4_;
                        fVar118 = fVar108 * (float)local_5c40;
                        fVar110 = auVar71._4_4_;
                        fVar120 = fVar110 * local_5c40._4_4_;
                        fVar111 = auVar71._8_4_;
                        fVar121 = fVar111 * (float)uStack_5c38;
                        fVar112 = auVar71._12_4_;
                        fVar122 = fVar112 * uStack_5c38._4_4_;
                        fVar113 = auVar71._16_4_;
                        fVar123 = fVar113 * (float)uStack_5c30;
                        fVar114 = auVar71._20_4_;
                        fVar124 = fVar114 * uStack_5c30._4_4_;
                        fVar115 = auVar71._24_4_;
                        fVar125 = fVar115 * (float)uStack_5c28;
                        fVar126 = fVar108 * (float)local_5c20._0_4_;
                        fVar128 = fVar110 * (float)local_5c20._4_4_;
                        fVar129 = fVar111 * fStack_5c18;
                        fVar130 = fVar112 * fStack_5c14;
                        fVar131 = fVar113 * fStack_5c10;
                        fVar132 = fVar114 * fStack_5c0c;
                        fVar133 = fVar115 * fStack_5c08;
                        fVar96 = auVar75._0_4_;
                        fVar134 = fVar96 * (float)local_5ce0;
                        fVar95 = auVar75._4_4_;
                        fVar137 = fVar95 * local_5ce0._4_4_;
                        fVar100 = auVar75._8_4_;
                        fVar138 = fVar100 * fStack_5cd8;
                        fVar101 = auVar75._12_4_;
                        fVar139 = fVar101 * fStack_5cd4;
                        fVar102 = auVar75._16_4_;
                        fVar140 = fVar102 * fStack_5cd0;
                        fVar103 = auVar75._20_4_;
                        fVar141 = fVar103 * fStack_5ccc;
                        fVar104 = auVar75._24_4_;
                        fVar142 = fVar104 * fStack_5cc8;
                        fVar143 = fVar96 * local_5cc0[0];
                        fVar146 = fVar95 * local_5cc0[1];
                        fVar147 = fVar100 * local_5cc0[2];
                        fVar148 = fVar101 * local_5cc0[3];
                        fVar149 = fVar102 * fStack_5cb0;
                        fVar150 = fVar103 * fStack_5cac;
                        fVar151 = fVar104 * fStack_5ca8;
                        if (local_5da2 != 0) {
                          lVar56 = *(long *)&pGVar4[2].numPrimitives;
                          uVar58 = (ulong)*(uint *)(local_5d60._0_8_ + 0x10 + uVar60 * 4);
                          uVar61 = local_5d70;
                          uVar69 = uVar68;
                          do {
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + (long)*(int *)(local_5d20 + uVar69 * 4) *
                                                           0x38) + uVar58 * 4);
                            auVar97 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar69 * 4) * 0x38) +
                                       uVar58 * 4);
                            *(int *)((long)&local_5c60 + uVar69 * 4) = auVar70._0_4_;
                            uVar66 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&local_5c40 + uVar69 * 4) = uVar66;
                            uVar66 = vextractps_avx(auVar70,2);
                            *(undefined4 *)(local_5c20 + uVar69 * 4) = uVar66;
                            *(int *)(local_5d00 + uVar69 * 4) = auVar97._0_4_;
                            uVar66 = vextractps_avx(auVar97,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar69 * 4) = uVar66;
                            fVar159 = (float)vextractps_avx(auVar97,2);
                            local_5cc0[uVar69] = fVar159;
                            uVar61 = uVar61 ^ 1L << (uVar69 & 0x3f);
                            uVar69 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar69 = uVar69 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar157._8_8_ = uStack_5c58;
                          auVar157._0_8_ = local_5c60;
                          auVar157._16_8_ = uStack_5c50;
                          auVar157._24_8_ = uStack_5c48;
                          auVar153._8_8_ = local_5d00._8_8_;
                          auVar153._0_8_ = local_5d00._0_8_;
                          auVar153._16_8_ = local_5d00._16_8_;
                          auVar153._24_8_ = local_5d00._24_8_;
                        }
                        fVar159 = fVar108 * (float)local_5c40;
                        fVar161 = fVar110 * local_5c40._4_4_;
                        fVar162 = fVar111 * (float)uStack_5c38;
                        fVar163 = fVar112 * uStack_5c38._4_4_;
                        fVar164 = fVar113 * (float)uStack_5c30;
                        fVar165 = fVar114 * uStack_5c30._4_4_;
                        fVar166 = fVar115 * (float)uStack_5c28;
                        fVar167 = fVar108 * (float)local_5c20._0_4_;
                        fVar168 = fVar110 * (float)local_5c20._4_4_;
                        fVar169 = fVar111 * fStack_5c18;
                        fVar170 = fVar112 * fStack_5c14;
                        fVar171 = fVar113 * fStack_5c10;
                        fVar172 = fVar114 * fStack_5c0c;
                        fVar173 = fVar115 * fStack_5c08;
                        fVar174 = fVar96 * (float)local_5ce0;
                        fVar175 = fVar95 * local_5ce0._4_4_;
                        fVar176 = fVar100 * fStack_5cd8;
                        fVar177 = fVar101 * fStack_5cd4;
                        fVar178 = fVar102 * fStack_5cd0;
                        fVar179 = fVar103 * fStack_5ccc;
                        fVar180 = fVar104 * fStack_5cc8;
                        fVar181 = fVar96 * local_5cc0[0];
                        fVar182 = fVar95 * local_5cc0[1];
                        fVar183 = fVar100 * local_5cc0[2];
                        fVar184 = fVar101 * local_5cc0[3];
                        fVar185 = fVar102 * fStack_5cb0;
                        fVar186 = fVar103 * fStack_5cac;
                        fVar187 = fVar104 * fStack_5ca8;
                        auVar188 = ZEXT436((uint)in_ZMM13._28_4_);
                        if (local_5da2 != 0) {
                          lVar56 = *(long *)&pGVar4[2].numPrimitives;
                          uVar58 = (ulong)*(uint *)(local_5d60._0_8_ + 0x20 + uVar60 * 4);
                          uVar61 = local_5d70;
                          uVar69 = uVar68;
                          do {
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + (long)*(int *)(local_5d20 + uVar69 * 4) *
                                                           0x38) + uVar58 * 4);
                            auVar97 = *(undefined1 (*) [16])
                                       (*(long *)(lVar56 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar69 * 4) * 0x38) +
                                       uVar58 * 4);
                            *(int *)((long)&local_5c60 + uVar69 * 4) = auVar70._0_4_;
                            uVar66 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&local_5c40 + uVar69 * 4) = uVar66;
                            uVar66 = vextractps_avx(auVar70,2);
                            *(undefined4 *)(local_5c20 + uVar69 * 4) = uVar66;
                            *(int *)(local_5d00 + uVar69 * 4) = auVar97._0_4_;
                            uVar66 = vextractps_avx(auVar97,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar69 * 4) = uVar66;
                            fVar2 = (float)vextractps_avx(auVar97,2);
                            local_5cc0[uVar69] = fVar2;
                            uVar61 = uVar61 ^ 1L << (uVar69 & 0x3f);
                            uVar69 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar69 = uVar69 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar53._8_8_ = uStack_5c58;
                          auVar53._0_8_ = local_5c60;
                          auVar53._16_8_ = uStack_5c50;
                          auVar53._24_8_ = uStack_5c48;
                          auVar189 = auVar53._0_28_;
                          in_ZMM14 = ZEXT3264(CONCAT824(local_5d00._24_8_,
                                                        CONCAT816(local_5d00._16_8_,
                                                                  CONCAT88(local_5d00._8_8_,
                                                                           local_5d00._0_8_))));
                        }
                        auVar81._0_4_ = fVar108 * auVar116._0_4_ + fVar96 * auVar80._0_4_;
                        auVar81._4_4_ = fVar110 * auVar116._4_4_ + fVar95 * auVar80._4_4_;
                        auVar81._8_4_ = fVar111 * auVar116._8_4_ + fVar100 * auVar80._8_4_;
                        auVar81._12_4_ = fVar112 * auVar116._12_4_ + fVar101 * auVar80._12_4_;
                        auVar81._16_4_ = fVar113 * auVar116._16_4_ + fVar102 * auVar80._16_4_;
                        auVar81._20_4_ = fVar114 * auVar116._20_4_ + fVar103 * auVar80._20_4_;
                        auVar81._24_4_ = fVar115 * auVar116._24_4_ + fVar104 * auVar80._24_4_;
                        auVar81._28_4_ = auVar116._28_4_ + auVar80._28_4_;
                        auVar82._0_4_ = fVar118 + fVar134;
                        auVar82._4_4_ = fVar120 + fVar137;
                        auVar82._8_4_ = fVar121 + fVar138;
                        auVar82._12_4_ = fVar122 + fVar139;
                        auVar82._16_4_ = fVar123 + fVar140;
                        auVar82._20_4_ = fVar124 + fVar141;
                        auVar82._24_4_ = fVar125 + fVar142;
                        auVar82._28_4_ = auVar119._28_4_ + auVar136._28_4_;
                        auVar83._0_4_ = fVar126 + fVar143;
                        auVar83._4_4_ = fVar128 + fVar146;
                        auVar83._8_4_ = fVar129 + fVar147;
                        auVar83._12_4_ = fVar130 + fVar148;
                        auVar83._16_4_ = fVar131 + fVar149;
                        auVar83._20_4_ = fVar132 + fVar150;
                        auVar83._24_4_ = fVar133 + fVar151;
                        auVar83._28_4_ = auVar127._28_4_ + auVar145._28_4_;
                        auVar84._0_4_ = auVar157._0_4_ * fVar108 + auVar153._0_4_ * fVar96;
                        auVar84._4_4_ = auVar157._4_4_ * fVar110 + auVar153._4_4_ * fVar95;
                        auVar84._8_4_ = auVar157._8_4_ * fVar111 + auVar153._8_4_ * fVar100;
                        auVar84._12_4_ = auVar157._12_4_ * fVar112 + auVar153._12_4_ * fVar101;
                        auVar84._16_4_ = auVar157._16_4_ * fVar113 + auVar153._16_4_ * fVar102;
                        auVar84._20_4_ = auVar157._20_4_ * fVar114 + auVar153._20_4_ * fVar103;
                        auVar84._24_4_ = auVar157._24_4_ * fVar115 + auVar153._24_4_ * fVar104;
                        auVar84._28_4_ = auVar127._28_4_ + auVar136._28_4_;
                        auVar85._0_4_ = fVar159 + fVar174;
                        auVar85._4_4_ = fVar161 + fVar175;
                        auVar85._8_4_ = fVar162 + fVar176;
                        auVar85._12_4_ = fVar163 + fVar177;
                        auVar85._16_4_ = fVar164 + fVar178;
                        auVar85._20_4_ = fVar165 + fVar179;
                        auVar85._24_4_ = fVar166 + fVar180;
                        auVar85._28_4_ = auVar160._28_4_ + in_ZMM12._28_4_;
                        auVar86._0_4_ = fVar167 + fVar181;
                        auVar86._4_4_ = fVar168 + fVar182;
                        auVar86._8_4_ = fVar169 + fVar183;
                        auVar86._12_4_ = fVar170 + fVar184;
                        auVar86._16_4_ = fVar171 + fVar185;
                        auVar86._20_4_ = fVar172 + fVar186;
                        auVar86._24_4_ = fVar173 + fVar187;
                        auVar86._28_4_ = in_ZMM11._28_4_ + in_ZMM13._28_4_;
                        auVar87._0_4_ = auVar189._0_4_ * fVar108 + in_ZMM14._0_4_ * fVar96;
                        auVar87._4_4_ = auVar189._4_4_ * fVar110 + in_ZMM14._4_4_ * fVar95;
                        auVar87._8_4_ = auVar189._8_4_ * fVar111 + in_ZMM14._8_4_ * fVar100;
                        auVar87._12_4_ = auVar189._12_4_ * fVar112 + in_ZMM14._12_4_ * fVar101;
                        auVar87._16_4_ = auVar189._16_4_ * fVar113 + in_ZMM14._16_4_ * fVar102;
                        auVar87._20_4_ = auVar189._20_4_ * fVar114 + in_ZMM14._20_4_ * fVar103;
                        auVar87._24_4_ = auVar189._24_4_ * fVar115 + in_ZMM14._24_4_ * fVar104;
                        auVar87._28_4_ = auVar153._28_4_ + auVar71._28_4_;
                        auVar88._0_4_ = fVar108 * (float)local_5c40 + fVar96 * (float)local_5ce0;
                        auVar88._4_4_ = fVar110 * local_5c40._4_4_ + fVar95 * local_5ce0._4_4_;
                        auVar88._8_4_ = fVar111 * (float)uStack_5c38 + fVar100 * fStack_5cd8;
                        auVar88._12_4_ = fVar112 * uStack_5c38._4_4_ + fVar101 * fStack_5cd4;
                        auVar88._16_4_ = fVar113 * (float)uStack_5c30 + fVar102 * fStack_5cd0;
                        auVar88._20_4_ = fVar114 * uStack_5c30._4_4_ + fVar103 * fStack_5ccc;
                        auVar88._24_4_ = fVar115 * (float)uStack_5c28 + fVar104 * fStack_5cc8;
                        auVar88._28_4_ = auVar157._28_4_ + auVar153._28_4_;
                        auVar89._0_4_ = fVar108 * (float)local_5c20._0_4_ + fVar96 * local_5cc0[0];
                        auVar89._4_4_ = fVar110 * (float)local_5c20._4_4_ + fVar95 * local_5cc0[1];
                        auVar89._8_4_ = fVar111 * fStack_5c18 + fVar100 * local_5cc0[2];
                        auVar89._12_4_ = fVar112 * fStack_5c14 + fVar101 * local_5cc0[3];
                        auVar89._16_4_ = fVar113 * fStack_5c10 + fVar102 * fStack_5cb0;
                        auVar89._20_4_ = fVar114 * fStack_5c0c + fVar103 * fStack_5cac;
                        auVar89._24_4_ = fVar115 * fStack_5c08 + fVar104 * fStack_5ca8;
                        auVar89._28_4_ = in_ZMM11._28_4_ + auVar75._28_4_;
                        lVar56 = local_5d60._0_8_;
                      }
                      local_5c70 = *(undefined8 *)(lVar56 + 0x30);
                      uStack_5c68 = *(undefined8 *)(lVar56 + 0x38);
                      local_5c80 = *(undefined8 *)(lVar56 + 0x40);
                      uStack_5c78 = *(undefined8 *)(lVar56 + 0x48);
                      auVar76 = vsubps_avx(auVar81,auVar84);
                      auVar155 = ZEXT3264(auVar76);
                      auVar77 = vsubps_avx(auVar82,auVar85);
                      auVar158 = ZEXT3264(auVar77);
                      auVar78 = vsubps_avx(auVar83,auVar86);
                      in_ZMM11 = ZEXT3264(auVar78);
                      auVar15 = vsubps_avx(auVar87,auVar81);
                      auVar16 = vsubps_avx(auVar88,auVar82);
                      auVar190 = ZEXT3264(auVar16);
                      auVar90 = vsubps_avx512vl(auVar89,auVar83);
                      auVar75 = vmulps_avx512vl(auVar77,auVar90);
                      auVar97 = vfmsub231ps_fma(auVar75,auVar16,auVar78);
                      auVar48._4_4_ = auVar78._4_4_ * auVar15._4_4_;
                      auVar48._0_4_ = auVar78._0_4_ * auVar15._0_4_;
                      auVar48._8_4_ = auVar78._8_4_ * auVar15._8_4_;
                      auVar48._12_4_ = auVar78._12_4_ * auVar15._12_4_;
                      auVar48._16_4_ = auVar78._16_4_ * auVar15._16_4_;
                      auVar48._20_4_ = auVar78._20_4_ * auVar15._20_4_;
                      auVar48._24_4_ = auVar78._24_4_ * auVar15._24_4_;
                      auVar48._28_4_ = auVar87._28_4_;
                      auVar91 = vfmsub231ps_avx512vl(auVar48,auVar90,auVar76);
                      auVar49._4_4_ = auVar76._4_4_ * auVar16._4_4_;
                      auVar49._0_4_ = auVar76._0_4_ * auVar16._0_4_;
                      auVar49._8_4_ = auVar76._8_4_ * auVar16._8_4_;
                      auVar49._12_4_ = auVar76._12_4_ * auVar16._12_4_;
                      auVar49._16_4_ = auVar76._16_4_ * auVar16._16_4_;
                      auVar49._20_4_ = auVar76._20_4_ * auVar16._20_4_;
                      auVar49._24_4_ = auVar76._24_4_ * auVar16._24_4_;
                      auVar49._28_4_ = auVar84._28_4_;
                      auVar105 = vfmsub231ps_fma(auVar49,auVar15,auVar77);
                      auVar127 = ZEXT1664(auVar105);
                      auVar17 = vsubps_avx(auVar81,*(undefined1 (*) [32])ray);
                      auVar18 = vsubps_avx(auVar82,*(undefined1 (*) [32])(ray + 0x20));
                      auVar19 = vsubps_avx(auVar83,*(undefined1 (*) [32])(ray + 0x40));
                      auVar75 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar71 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar72 = *(undefined1 (*) [32])(ray + 0xc0);
                      auVar92 = vmulps_avx512vl(auVar71,auVar19);
                      auVar23 = vfmsub231ps_fma(auVar92,auVar18,auVar72);
                      in_ZMM12 = ZEXT1664(auVar23);
                      auVar119._0_4_ = auVar72._0_4_ * auVar17._0_4_;
                      auVar119._4_4_ = auVar72._4_4_ * auVar17._4_4_;
                      auVar119._8_4_ = auVar72._8_4_ * auVar17._8_4_;
                      auVar119._12_4_ = auVar72._12_4_ * auVar17._12_4_;
                      auVar119._16_4_ = auVar72._16_4_ * auVar17._16_4_;
                      auVar119._20_4_ = auVar72._20_4_ * auVar17._20_4_;
                      auVar119._24_4_ = auVar72._24_4_ * auVar17._24_4_;
                      auVar119._28_36_ = auVar188;
                      auVar24 = vfmsub231ps_fma(auVar119._0_32_,auVar19,auVar75);
                      in_ZMM13 = ZEXT1664(auVar24);
                      auVar136._0_4_ = auVar75._0_4_ * auVar18._0_4_;
                      auVar136._4_4_ = auVar75._4_4_ * auVar18._4_4_;
                      auVar136._8_4_ = auVar75._8_4_ * auVar18._8_4_;
                      auVar136._12_4_ = auVar75._12_4_ * auVar18._12_4_;
                      auVar136._16_4_ = auVar75._16_4_ * auVar18._16_4_;
                      auVar136._20_4_ = auVar75._20_4_ * auVar18._20_4_;
                      auVar136._28_36_ = in_ZMM14._28_36_;
                      auVar136._24_4_ = auVar75._24_4_ * auVar18._24_4_;
                      auVar92 = vfmsub231ps_avx512vl(auVar136._0_32_,auVar17,auVar71);
                      in_ZMM14 = ZEXT3264(auVar92);
                      auVar50._4_4_ = auVar105._4_4_ * auVar72._4_4_;
                      auVar50._0_4_ = auVar105._0_4_ * auVar72._0_4_;
                      auVar50._8_4_ = auVar105._8_4_ * auVar72._8_4_;
                      auVar50._12_4_ = auVar105._12_4_ * auVar72._12_4_;
                      auVar50._16_4_ = auVar72._16_4_ * 0.0;
                      auVar50._20_4_ = auVar72._20_4_ * 0.0;
                      auVar50._24_4_ = auVar72._24_4_ * 0.0;
                      auVar50._28_4_ = auVar72._28_4_;
                      auVar71 = vfmadd231ps_avx512vl(auVar50,auVar91,auVar71);
                      auVar70 = vfmadd231ps_fma(auVar71,ZEXT1632(auVar97),auVar75);
                      auVar119 = ZEXT1664(auVar70);
                      vandps_avx512vl(ZEXT1632(auVar70),auVar194._0_32_);
                      auVar160 = ZEXT3264(auVar71);
                      auVar75 = vmulps_avx512vl(auVar90,auVar92);
                      auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar24),auVar16);
                      auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar23),auVar15);
                      auVar75 = vxorps_avx512vl(auVar71,auVar75);
                      auVar136 = ZEXT3264(auVar75);
                      uVar20 = vcmpps_avx512vl(auVar75,auVar74,5);
                      bVar55 = (byte)uVar20 & bVar65;
                      if (bVar55 == 0) {
LAB_01f5a9cd:
                        bVar55 = 0;
                      }
                      else {
                        auVar51._4_4_ = auVar78._4_4_ * auVar92._4_4_;
                        auVar51._0_4_ = auVar78._0_4_ * auVar92._0_4_;
                        auVar51._8_4_ = auVar78._8_4_ * auVar92._8_4_;
                        auVar51._12_4_ = auVar78._12_4_ * auVar92._12_4_;
                        auVar51._16_4_ = auVar78._16_4_ * auVar92._16_4_;
                        auVar51._20_4_ = auVar78._20_4_ * auVar92._20_4_;
                        auVar51._24_4_ = auVar78._24_4_ * auVar92._24_4_;
                        auVar51._28_4_ = auVar78._28_4_;
                        in_ZMM11 = ZEXT3264(auVar51);
                        auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar77,auVar51);
                        in_ZMM13 = ZEXT1664(auVar24);
                        auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar76,ZEXT1632(auVar24));
                        in_ZMM12 = ZEXT1664(auVar23);
                        auVar154._0_4_ = auVar71._0_4_ ^ auVar23._0_4_;
                        auVar154._4_4_ = auVar71._4_4_ ^ auVar23._4_4_;
                        auVar154._8_4_ = auVar71._8_4_ ^ auVar23._8_4_;
                        auVar154._12_4_ = auVar71._12_4_ ^ auVar23._12_4_;
                        auVar154._16_4_ = auVar71._16_4_;
                        auVar154._20_4_ = auVar71._20_4_;
                        auVar154._24_4_ = auVar71._24_4_;
                        auVar154._28_4_ = auVar71._28_4_;
                        auVar155 = ZEXT3264(auVar154);
                        uVar20 = vcmpps_avx512vl(auVar154,auVar74,5);
                        bVar55 = bVar55 & (byte)uVar20;
                        if (bVar55 == 0) goto LAB_01f5a9cd;
                        auVar46._8_4_ = 0x7fffffff;
                        auVar46._0_8_ = 0x7fffffff7fffffff;
                        auVar46._12_4_ = 0x7fffffff;
                        auVar46._16_4_ = 0x7fffffff;
                        auVar46._20_4_ = 0x7fffffff;
                        auVar46._24_4_ = 0x7fffffff;
                        auVar46._28_4_ = 0x7fffffff;
                        vandps_avx512vl(ZEXT1632(auVar70),auVar46);
                        auVar158 = ZEXT3264(auVar75);
                        auVar74 = vsubps_avx(auVar75,auVar75);
                        in_ZMM11 = ZEXT3264(auVar74);
                        uVar20 = vcmpps_avx512vl(auVar74,auVar154,5);
                        bVar55 = bVar55 & (byte)uVar20;
                        if (bVar55 == 0) goto LAB_01f5a9cd;
                        in_ZMM11 = ZEXT864(0) << 0x20;
                        auVar52._4_4_ = auVar105._4_4_ * auVar19._4_4_;
                        auVar52._0_4_ = auVar105._0_4_ * auVar19._0_4_;
                        auVar52._8_4_ = auVar105._8_4_ * auVar19._8_4_;
                        auVar52._12_4_ = auVar105._12_4_ * auVar19._12_4_;
                        auVar52._16_4_ = auVar19._16_4_ * 0.0;
                        auVar52._20_4_ = auVar19._20_4_ * 0.0;
                        uVar66 = auVar19._28_4_;
                        auVar52._24_4_ = auVar19._24_4_ * 0.0;
                        auVar52._28_4_ = uVar66;
                        auVar23 = vfmadd213ps_fma(auVar18,auVar91,auVar52);
                        auVar23 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar97),ZEXT1632(auVar23));
                        auVar117._0_4_ = auVar75._0_4_ * *(float *)(ray + 0x60);
                        auVar117._4_4_ = auVar75._4_4_ * *(float *)(ray + 100);
                        auVar117._8_4_ = auVar75._8_4_ * *(float *)(ray + 0x68);
                        auVar117._12_4_ = auVar75._12_4_ * *(float *)(ray + 0x6c);
                        auVar117._16_4_ = auVar75._16_4_ * *(float *)(ray + 0x70);
                        auVar117._20_4_ = auVar75._20_4_ * *(float *)(ray + 0x74);
                        auVar117._24_4_ = auVar75._24_4_ * *(float *)(ray + 0x78);
                        auVar117._28_4_ = 0;
                        auVar107._0_4_ = auVar71._0_4_ ^ auVar23._0_4_;
                        auVar107._4_4_ = auVar71._4_4_ ^ auVar23._4_4_;
                        auVar107._8_4_ = auVar71._8_4_ ^ auVar23._8_4_;
                        auVar107._12_4_ = auVar71._12_4_ ^ auVar23._12_4_;
                        auVar107._16_4_ = auVar71._16_4_;
                        auVar107._20_4_ = auVar71._20_4_;
                        auVar107._24_4_ = auVar71._24_4_;
                        auVar107._28_4_ = auVar71._28_4_;
                        auVar19._4_4_ = auVar75._4_4_ * *(float *)(ray + 0x104);
                        auVar19._0_4_ = auVar75._0_4_ * *(float *)(ray + 0x100);
                        auVar19._8_4_ = auVar75._8_4_ * *(float *)(ray + 0x108);
                        auVar19._12_4_ = auVar75._12_4_ * *(float *)(ray + 0x10c);
                        auVar19._16_4_ = auVar75._16_4_ * *(float *)(ray + 0x110);
                        auVar19._20_4_ = auVar75._20_4_ * *(float *)(ray + 0x114);
                        auVar19._24_4_ = auVar75._24_4_ * *(float *)(ray + 0x118);
                        auVar19._28_4_ = uVar66;
                        uVar20 = vcmpps_avx512vl(auVar107,auVar19,2);
                        uVar21 = vcmpps_avx512vl(auVar117,auVar107,1);
                        bVar55 = bVar55 & (byte)uVar20 & (byte)uVar21;
                        if (bVar55 == 0) {
LAB_01f5b0e0:
                          bVar55 = 0;
                        }
                        else {
                          uVar20 = vcmpps_avx512vl(ZEXT1632(auVar70),ZEXT832(0) << 0x20,4);
                          bVar55 = bVar55 & (byte)uVar20;
                          if (bVar55 == 0) goto LAB_01f5b0e0;
                          _local_5840 = auVar75;
                          _local_5860 = auVar154;
                          local_5880 = auVar107;
                          local_58a0 = auVar75;
                          local_58c0 = ZEXT1632(auVar97);
                          local_58e0 = auVar91;
                          local_5900 = ZEXT1632(auVar105);
                        }
                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar192 = ZEXT3264(auVar74);
                        auVar70 = vxorps_avx512vl(auVar193._0_16_,auVar193._0_16_);
                        auVar193 = ZEXT1664(auVar70);
                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar194 = ZEXT3264(auVar74);
                      }
                      auVar145 = ZEXT3264(auVar19);
                      auVar70 = auVar193._0_16_;
                      pGVar4 = pRVar3[*(uint *)((long)&local_5c70 + uVar60 * 4)].ptr;
                      uVar64 = pGVar4->mask;
                      auVar99._4_4_ = uVar64;
                      auVar99._0_4_ = uVar64;
                      auVar99._8_4_ = uVar64;
                      auVar99._12_4_ = uVar64;
                      auVar99._16_4_ = uVar64;
                      auVar99._20_4_ = uVar64;
                      auVar99._24_4_ = uVar64;
                      auVar99._28_4_ = uVar64;
                      uVar20 = vptestmd_avx512vl(auVar99,*(undefined1 (*) [32])(ray + 0x120));
                      bVar55 = (byte)uVar20 & bVar55;
                      if (bVar55 != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (lVar56 = local_5d60._0_8_,
                           pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar74 = vrcp14ps_avx512vl(local_58a0);
                          auVar73 = vfnmadd213ps_avx512vl(auVar74,local_58a0,auVar73);
                          auVar97 = vfmadd132ps_fma(auVar73,auVar74,auVar74);
                          local_5c00._4_4_ = auVar97._4_4_ * (float)local_5840._4_4_;
                          local_5c00._0_4_ = auVar97._0_4_ * (float)local_5840._0_4_;
                          local_5c00._8_4_ = auVar97._8_4_ * fStack_5838;
                          local_5c00._12_4_ = auVar97._12_4_ * fStack_5834;
                          local_5c00._16_4_ = fStack_5830 * 0.0;
                          local_5c00._20_4_ = fStack_582c * 0.0;
                          local_5c00._24_4_ = fStack_5828 * 0.0;
                          local_5c00._28_4_ = auVar74._28_4_;
                          local_5ba0 = vpbroadcastd_avx512vl();
                          local_5bc0 = vpbroadcastd_avx512vl();
                          auVar119 = ZEXT3264(local_5bc0);
                          local_5c60 = local_58c0._0_8_;
                          uStack_5c58 = local_58c0._8_8_;
                          uStack_5c50 = local_58c0._16_8_;
                          uStack_5c48 = local_58c0._24_8_;
                          local_5c40 = local_58e0._0_8_;
                          uStack_5c38 = local_58e0._8_8_;
                          uStack_5c30 = local_58e0._16_8_;
                          uStack_5c28 = local_58e0._24_8_;
                          auVar127 = ZEXT3264(local_5900);
                          _local_5c20 = local_5900;
                          local_5be0 = auVar97._0_4_ * (float)local_5860._0_4_;
                          fStack_5bdc = auVar97._4_4_ * (float)local_5860._4_4_;
                          fStack_5bd8 = auVar97._8_4_ * fStack_5858;
                          fStack_5bd4 = auVar97._12_4_ * fStack_5854;
                          fStack_5bd0 = fStack_5850 * 0.0;
                          fStack_5bcc = fStack_584c * 0.0;
                          fStack_5bc8 = fStack_5848 * 0.0;
                          uStack_5bc4 = local_58a0._28_4_;
                          vpcmpeqd_avx2(local_5c00,local_5c00);
                          uStack_5b7c = context->user->instID[0];
                          local_5b80 = uStack_5b7c;
                          uStack_5b78 = uStack_5b7c;
                          uStack_5b74 = uStack_5b7c;
                          uStack_5b70 = uStack_5b7c;
                          uStack_5b6c = uStack_5b7c;
                          uStack_5b68 = uStack_5b7c;
                          uStack_5b64 = uStack_5b7c;
                          uStack_5b5c = context->user->instPrimID[0];
                          local_5b60 = uStack_5b5c;
                          uStack_5b58 = uStack_5b5c;
                          uStack_5b54 = uStack_5b5c;
                          uStack_5b50 = uStack_5b5c;
                          uStack_5b4c = uStack_5b5c;
                          uStack_5b48 = uStack_5b5c;
                          uStack_5b44 = uStack_5b5c;
                          local_5b40 = *(int *)(ray + 0x100);
                          iStack_5b3c = *(int *)(ray + 0x104);
                          iStack_5b38 = *(int *)(ray + 0x108);
                          iStack_5b34 = *(int *)(ray + 0x10c);
                          iStack_5b30 = *(int *)(ray + 0x110);
                          iStack_5b2c = *(int *)(ray + 0x114);
                          iStack_5b28 = *(int *)(ray + 0x118);
                          iStack_5b24 = *(int *)(ray + 0x11c);
                          auVar73 = vmulps_avx512vl(ZEXT1632(auVar97),local_5880);
                          bVar67 = (bool)(bVar55 >> 1 & 1);
                          bVar8 = (bool)(bVar55 >> 2 & 1);
                          bVar9 = (bool)(bVar55 >> 3 & 1);
                          bVar10 = (bool)(bVar55 >> 4 & 1);
                          bVar11 = (bool)(bVar55 >> 5 & 1);
                          bVar12 = (bool)(bVar55 >> 6 & 1);
                          *(uint *)(ray + 0x100) =
                               (uint)(bVar55 & 1) * auVar73._0_4_ |
                               (uint)!(bool)(bVar55 & 1) * local_5b40;
                          *(uint *)(ray + 0x104) =
                               (uint)bVar67 * auVar73._4_4_ | (uint)!bVar67 * iStack_5b3c;
                          *(uint *)(ray + 0x108) =
                               (uint)bVar8 * auVar73._8_4_ | (uint)!bVar8 * iStack_5b38;
                          *(uint *)(ray + 0x10c) =
                               (uint)bVar9 * auVar73._12_4_ | (uint)!bVar9 * iStack_5b34;
                          *(uint *)(ray + 0x110) =
                               (uint)bVar10 * auVar73._16_4_ | (uint)!bVar10 * iStack_5b30;
                          *(uint *)(ray + 0x114) =
                               (uint)bVar11 * auVar73._20_4_ | (uint)!bVar11 * iStack_5b2c;
                          *(uint *)(ray + 0x118) =
                               (uint)bVar12 * auVar73._24_4_ | (uint)!bVar12 * iStack_5b28;
                          *(uint *)(ray + 0x11c) =
                               (uint)(bVar55 >> 7) * auVar73._28_4_ |
                               (uint)!(bool)(bVar55 >> 7) * iStack_5b24;
                          local_5d20 = vpmovm2d_avx512vl((ulong)bVar55);
                          local_5d00._0_8_ = local_5d20;
                          local_5d00._8_8_ = pGVar4->userPtr;
                          local_5d00._16_8_ = context->user;
                          local_5d00._24_8_ = ray;
                          local_5ce0 = (RTCHitN *)&local_5c60;
                          fStack_5cd8 = 1.12104e-44;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar119 = ZEXT1664(local_5bc0._0_16_);
                            auVar127 = ZEXT1664(local_5900._0_16_);
                            auVar136 = ZEXT1664(auVar75._0_16_);
                            auVar145 = ZEXT1664(auVar19._0_16_);
                            auVar155 = ZEXT1664(auVar155._0_16_);
                            auVar158 = ZEXT1664(auVar158._0_16_);
                            auVar160 = ZEXT1664(auVar71._0_16_);
                            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                            in_ZMM14 = ZEXT1664(auVar92._0_16_);
                            auVar190 = ZEXT1664(auVar16._0_16_);
                            (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)local_5d00);
                            auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar194 = ZEXT3264(auVar75);
                            auVar70 = vxorps_avx512vl(auVar70,auVar70);
                            auVar193 = ZEXT1664(auVar70);
                            auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar192 = ZEXT3264(auVar75);
                            auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar191 = ZEXT3264(auVar75);
                          }
                          auVar70 = auVar193._0_16_;
                          if (local_5d20 == (undefined1  [32])0x0) {
                            uVar69 = 0;
                            lVar56 = local_5d60._0_8_;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar119 = ZEXT1664(auVar119._0_16_);
                              auVar127 = ZEXT1664(auVar127._0_16_);
                              auVar136 = ZEXT1664(auVar136._0_16_);
                              auVar145 = ZEXT1664(auVar145._0_16_);
                              auVar155 = ZEXT1664(auVar155._0_16_);
                              auVar158 = ZEXT1664(auVar158._0_16_);
                              auVar160 = ZEXT1664(auVar160._0_16_);
                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                              auVar190 = ZEXT1664(auVar190._0_16_);
                              (*p_Var7)((RTCFilterFunctionNArguments *)local_5d00);
                              auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar194 = ZEXT3264(auVar75);
                              auVar70 = vxorps_avx512vl(auVar70,auVar70);
                              auVar193 = ZEXT1664(auVar70);
                              auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar192 = ZEXT3264(auVar75);
                              auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar191 = ZEXT3264(auVar75);
                            }
                            uVar69 = vptestmd_avx512vl(local_5d20,local_5d20);
                            auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar67 = (bool)((byte)uVar69 & 1);
                            auVar93._0_4_ =
                                 (uint)bVar67 * auVar75._0_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x100);
                            bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
                            auVar93._4_4_ =
                                 (uint)bVar67 * auVar75._4_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x104);
                            bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
                            auVar93._8_4_ =
                                 (uint)bVar67 * auVar75._8_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x108);
                            bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
                            auVar93._12_4_ =
                                 (uint)bVar67 * auVar75._12_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x10c);
                            bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
                            auVar93._16_4_ =
                                 (uint)bVar67 * auVar75._16_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x110);
                            bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
                            auVar93._20_4_ =
                                 (uint)bVar67 * auVar75._20_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x114);
                            bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
                            auVar93._24_4_ =
                                 (uint)bVar67 * auVar75._24_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x118);
                            bVar67 = SUB81(uVar69 >> 7,0);
                            auVar93._28_4_ =
                                 (uint)bVar67 * auVar75._28_4_ |
                                 (uint)!bVar67 * *(int *)(local_5d00._24_8_ + 0x11c);
                            *(undefined1 (*) [32])(local_5d00._24_8_ + 0x100) = auVar93;
                            lVar56 = local_5d60._0_8_;
                          }
                          bVar55 = (byte)uVar69;
                          auVar94._0_4_ =
                               (uint)(bVar55 & 1) * *(int *)local_5d28 |
                               (uint)!(bool)(bVar55 & 1) * local_5b40;
                          bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
                          auVar94._4_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 4) | (uint)!bVar67 * iStack_5b3c
                          ;
                          bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
                          auVar94._8_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 8) | (uint)!bVar67 * iStack_5b38
                          ;
                          bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
                          auVar94._12_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 0xc) |
                               (uint)!bVar67 * iStack_5b34;
                          bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
                          auVar94._16_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 0x10) |
                               (uint)!bVar67 * iStack_5b30;
                          bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
                          auVar94._20_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 0x14) |
                               (uint)!bVar67 * iStack_5b2c;
                          bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
                          auVar94._24_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 0x18) |
                               (uint)!bVar67 * iStack_5b28;
                          bVar67 = (bool)((byte)(uVar69 >> 7) & 1);
                          auVar94._28_4_ =
                               (uint)bVar67 * *(int *)(local_5d28 + 0x1c) |
                               (uint)!bVar67 * iStack_5b24;
                          *(undefined1 (*) [32])local_5d28 = auVar94;
                        }
                        bVar65 = bVar65 & ~bVar55;
                      }
                      if ((bVar65 == 0) || (bVar67 = 2 < uVar60, uVar60 = uVar60 + 1, bVar67))
                      break;
                    }
                    local_5da2 = local_5da2 & bVar65;
                  } while ((local_5da2 != 0) && (uVar68 = local_5c88 + 1, uVar68 < local_5c90));
                  bVar65 = ~local_5da2;
                }
                bVar59 = bVar59 | bVar65;
                if (bVar59 == 0xff) {
                  bVar59 = 0xff;
                  goto LAB_01f5b248;
                }
                auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_5920._0_4_ =
                     (uint)(bVar59 & 1) * auVar75._0_4_ |
                     (uint)!(bool)(bVar59 & 1) * local_5920._0_4_;
                bVar67 = (bool)(bVar59 >> 1 & 1);
                local_5920._4_4_ = (uint)bVar67 * auVar75._4_4_ | (uint)!bVar67 * local_5920._4_4_;
                bVar67 = (bool)(bVar59 >> 2 & 1);
                local_5920._8_4_ = (uint)bVar67 * auVar75._8_4_ | (uint)!bVar67 * local_5920._8_4_;
                bVar67 = (bool)(bVar59 >> 3 & 1);
                local_5920._12_4_ =
                     (uint)bVar67 * auVar75._12_4_ | (uint)!bVar67 * local_5920._12_4_;
                bVar67 = (bool)(bVar59 >> 4 & 1);
                local_5920._16_4_ =
                     (uint)bVar67 * auVar75._16_4_ | (uint)!bVar67 * local_5920._16_4_;
                bVar67 = (bool)(bVar59 >> 5 & 1);
                local_5920._20_4_ =
                     (uint)bVar67 * auVar75._20_4_ | (uint)!bVar67 * local_5920._20_4_;
                bVar67 = (bool)(bVar59 >> 6 & 1);
                local_5920._24_4_ =
                     (uint)bVar67 * auVar75._24_4_ | (uint)!bVar67 * local_5920._24_4_;
                local_5920._28_4_ =
                     (uint)(bVar59 >> 7) * auVar75._28_4_ |
                     (uint)!(bool)(bVar59 >> 7) * local_5920._28_4_;
              }
              goto LAB_01f5a4b4;
            }
            uVar68 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar56 = -0x20;
            auVar75 = auVar192._0_32_;
            do {
              uVar60 = *(ulong *)(uVar68 + 0x40 + lVar56 * 2);
              if (uVar60 == 8) break;
              uVar66 = *(undefined4 *)(uVar68 + 0x120 + lVar56);
              auVar91._4_4_ = uVar66;
              auVar91._0_4_ = uVar66;
              auVar91._8_4_ = uVar66;
              auVar91._12_4_ = uVar66;
              auVar91._16_4_ = uVar66;
              auVar91._20_4_ = uVar66;
              auVar91._24_4_ = uVar66;
              auVar91._28_4_ = uVar66;
              auVar73 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar66 = *(undefined4 *)(uVar68 + 0x60 + lVar56);
              auVar76._4_4_ = uVar66;
              auVar76._0_4_ = uVar66;
              auVar76._8_4_ = uVar66;
              auVar76._12_4_ = uVar66;
              auVar76._16_4_ = uVar66;
              auVar76._20_4_ = uVar66;
              auVar76._24_4_ = uVar66;
              auVar76._28_4_ = uVar66;
              auVar74 = vfmadd213ps_avx512vl(auVar91,auVar73,auVar76);
              uVar66 = *(undefined4 *)(uVar68 + 0x160 + lVar56);
              auVar92._4_4_ = uVar66;
              auVar92._0_4_ = uVar66;
              auVar92._8_4_ = uVar66;
              auVar92._12_4_ = uVar66;
              auVar92._16_4_ = uVar66;
              auVar92._20_4_ = uVar66;
              auVar92._24_4_ = uVar66;
              auVar92._28_4_ = uVar66;
              uVar66 = *(undefined4 *)(uVar68 + 0xa0 + lVar56);
              auVar77._4_4_ = uVar66;
              auVar77._0_4_ = uVar66;
              auVar77._8_4_ = uVar66;
              auVar77._12_4_ = uVar66;
              auVar77._16_4_ = uVar66;
              auVar77._20_4_ = uVar66;
              auVar77._24_4_ = uVar66;
              auVar77._28_4_ = uVar66;
              auVar71 = vfmadd213ps_avx512vl(auVar92,auVar73,auVar77);
              uVar66 = *(undefined4 *)(uVar68 + 0x1a0 + lVar56);
              auVar135._4_4_ = uVar66;
              auVar135._0_4_ = uVar66;
              auVar135._8_4_ = uVar66;
              auVar135._12_4_ = uVar66;
              auVar135._16_4_ = uVar66;
              auVar135._20_4_ = uVar66;
              auVar135._24_4_ = uVar66;
              auVar135._28_4_ = uVar66;
              uVar66 = *(undefined4 *)(uVar68 + 0xe0 + lVar56);
              auVar78._4_4_ = uVar66;
              auVar78._0_4_ = uVar66;
              auVar78._8_4_ = uVar66;
              auVar78._12_4_ = uVar66;
              auVar78._16_4_ = uVar66;
              auVar78._20_4_ = uVar66;
              auVar78._24_4_ = uVar66;
              auVar78._28_4_ = uVar66;
              auVar72 = vfmadd213ps_avx512vl(auVar135,auVar73,auVar78);
              uVar66 = *(undefined4 *)(uVar68 + 0x140 + lVar56);
              auVar144._4_4_ = uVar66;
              auVar144._0_4_ = uVar66;
              auVar144._8_4_ = uVar66;
              auVar144._12_4_ = uVar66;
              auVar144._16_4_ = uVar66;
              auVar144._20_4_ = uVar66;
              auVar144._24_4_ = uVar66;
              auVar144._28_4_ = uVar66;
              uVar66 = *(undefined4 *)(uVar68 + 0x80 + lVar56);
              auVar15._4_4_ = uVar66;
              auVar15._0_4_ = uVar66;
              auVar15._8_4_ = uVar66;
              auVar15._12_4_ = uVar66;
              auVar15._16_4_ = uVar66;
              auVar15._20_4_ = uVar66;
              auVar15._24_4_ = uVar66;
              auVar15._28_4_ = uVar66;
              auVar76 = vfmadd213ps_avx512vl(auVar144,auVar73,auVar15);
              uVar66 = *(undefined4 *)(uVar68 + 0x180 + lVar56);
              auVar152._4_4_ = uVar66;
              auVar152._0_4_ = uVar66;
              auVar152._8_4_ = uVar66;
              auVar152._12_4_ = uVar66;
              auVar152._16_4_ = uVar66;
              auVar152._20_4_ = uVar66;
              auVar152._24_4_ = uVar66;
              auVar152._28_4_ = uVar66;
              uVar66 = *(undefined4 *)(uVar68 + 0xc0 + lVar56);
              auVar16._4_4_ = uVar66;
              auVar16._0_4_ = uVar66;
              auVar16._8_4_ = uVar66;
              auVar16._12_4_ = uVar66;
              auVar16._16_4_ = uVar66;
              auVar16._20_4_ = uVar66;
              auVar16._24_4_ = uVar66;
              auVar16._28_4_ = uVar66;
              auVar77 = vfmadd213ps_avx512vl(auVar152,auVar73,auVar16);
              uVar66 = *(undefined4 *)(uVar68 + 0x1c0 + lVar56);
              auVar156._4_4_ = uVar66;
              auVar156._0_4_ = uVar66;
              auVar156._8_4_ = uVar66;
              auVar156._12_4_ = uVar66;
              auVar156._16_4_ = uVar66;
              auVar156._20_4_ = uVar66;
              auVar156._24_4_ = uVar66;
              auVar156._28_4_ = uVar66;
              uVar66 = *(undefined4 *)(uVar68 + 0x100 + lVar56);
              auVar17._4_4_ = uVar66;
              auVar17._0_4_ = uVar66;
              auVar17._8_4_ = uVar66;
              auVar17._12_4_ = uVar66;
              auVar17._16_4_ = uVar66;
              auVar17._20_4_ = uVar66;
              auVar17._24_4_ = uVar66;
              auVar17._28_4_ = uVar66;
              auVar78 = vfmadd213ps_avx512vl(auVar156,auVar73,auVar17);
              in_ZMM11 = ZEXT3264(local_5a20);
              auVar18._4_4_ = fStack_59fc;
              auVar18._0_4_ = local_5a00;
              auVar18._8_4_ = fStack_59f8;
              auVar18._12_4_ = fStack_59f4;
              auVar18._16_4_ = fStack_59f0;
              auVar18._20_4_ = fStack_59ec;
              auVar18._24_4_ = fStack_59e8;
              auVar18._28_4_ = uStack_59e4;
              in_ZMM12 = ZEXT3264(auVar18);
              auVar70 = vfmsub213ps_fma(auVar74,local_5a60,auVar18);
              auVar90._4_4_ = fStack_59dc;
              auVar90._0_4_ = local_59e0;
              auVar90._8_4_ = fStack_59d8;
              auVar90._12_4_ = fStack_59d4;
              auVar90._16_4_ = fStack_59d0;
              auVar90._20_4_ = fStack_59cc;
              auVar90._24_4_ = fStack_59c8;
              auVar90._28_4_ = uStack_59c4;
              in_ZMM13 = ZEXT3264(auVar90);
              auVar97 = vfmsub213ps_fma(auVar71,local_5a40,auVar90);
              in_ZMM14 = ZEXT3264(local_59c0);
              auVar105 = vfmsub213ps_fma(auVar72,local_5a20,local_59c0);
              auVar136 = ZEXT1664(auVar105);
              auVar23 = vfmsub213ps_fma(auVar76,local_5a60,auVar18);
              auVar145 = ZEXT1664(auVar23);
              auVar24 = vfmsub213ps_fma(auVar77,local_5a40,auVar90);
              auVar155 = ZEXT1664(auVar24);
              auVar25 = vfmsub213ps_fma(auVar78,local_5a20,local_59c0);
              auVar158 = ZEXT1664(auVar25);
              auVar74 = vpminsd_avx2(ZEXT1632(auVar70),ZEXT1632(auVar23));
              auVar71 = vpminsd_avx2(ZEXT1632(auVar97),ZEXT1632(auVar24));
              auVar74 = vpmaxsd_avx2(auVar74,auVar71);
              auVar71 = vpminsd_avx2(ZEXT1632(auVar105),ZEXT1632(auVar25));
              auVar160 = ZEXT3264(auVar71);
              auVar74 = vpmaxsd_avx2(auVar74,auVar71);
              auVar71 = vpmaxsd_avx2(ZEXT1632(auVar70),ZEXT1632(auVar23));
              auVar72 = vpmaxsd_avx2(ZEXT1632(auVar97),ZEXT1632(auVar24));
              auVar72 = vpminsd_avx2(auVar71,auVar72);
              auVar71 = vpmaxsd_avx2(ZEXT1632(auVar105),ZEXT1632(auVar25));
              auVar72 = vpminsd_avx2(auVar72,auVar71);
              auVar71 = vpmaxsd_avx2(auVar74,local_5940);
              auVar119 = ZEXT3264(auVar71);
              auVar72 = vpminsd_avx2(auVar72,local_5920);
              auVar127 = ZEXT3264(auVar72);
              uVar69 = vcmpps_avx512vl(auVar71,auVar72,2);
              if ((uVar64 & 7) == 6) {
                uVar66 = *(undefined4 *)(uVar68 + 0x1e0 + lVar56);
                auVar26._4_4_ = uVar66;
                auVar26._0_4_ = uVar66;
                auVar26._8_4_ = uVar66;
                auVar26._12_4_ = uVar66;
                auVar26._16_4_ = uVar66;
                auVar26._20_4_ = uVar66;
                auVar26._24_4_ = uVar66;
                auVar26._28_4_ = uVar66;
                uVar61 = vcmpps_avx512vl(auVar73,auVar26,0xd);
                uVar66 = *(undefined4 *)(uVar68 + 0x200 + lVar56);
                auVar27._4_4_ = uVar66;
                auVar27._0_4_ = uVar66;
                auVar27._8_4_ = uVar66;
                auVar27._12_4_ = uVar66;
                auVar27._16_4_ = uVar66;
                auVar27._20_4_ = uVar66;
                auVar27._24_4_ = uVar66;
                auVar27._28_4_ = uVar66;
                uVar58 = vcmpps_avx512vl(auVar73,auVar27,1);
                uVar69 = uVar69 & uVar61 & uVar58;
              }
              uVar61 = vcmpps_avx512vl(local_5920,auVar190._0_32_,6);
              uVar69 = uVar69 & uVar61;
              uVar61 = root.ptr;
              auVar79 = auVar75;
              if ((byte)uVar69 != 0) {
                auVar74 = vblendmps_avx512vl(auVar192._0_32_,auVar74);
                bVar67 = (bool)((byte)uVar69 & 1);
                auVar79._0_4_ = (uint)bVar67 * auVar74._0_4_ | (uint)!bVar67 * auVar73._0_4_;
                bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar79._4_4_ = (uint)bVar67 * auVar74._4_4_ | (uint)!bVar67 * auVar73._4_4_;
                bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar79._8_4_ = (uint)bVar67 * auVar74._8_4_ | (uint)!bVar67 * auVar73._8_4_;
                bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar79._12_4_ = (uint)bVar67 * auVar74._12_4_ | (uint)!bVar67 * auVar73._12_4_;
                bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar79._16_4_ = (uint)bVar67 * auVar74._16_4_ | (uint)!bVar67 * auVar73._16_4_;
                bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar79._20_4_ = (uint)bVar67 * auVar74._20_4_ | (uint)!bVar67 * auVar73._20_4_;
                bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar79._24_4_ = (uint)bVar67 * auVar74._24_4_ | (uint)!bVar67 * auVar73._24_4_;
                bVar67 = SUB81(uVar69 >> 7,0);
                auVar79._28_4_ = (uint)bVar67 * auVar74._28_4_ | (uint)!bVar67 * auVar73._28_4_;
                uVar61 = uVar60;
                if (root.ptr != 8) {
                  *puVar63 = root.ptr;
                  puVar63 = puVar63 + 1;
                  *pauVar57 = auVar75;
                  pauVar57 = pauVar57 + 1;
                }
              }
              auVar75 = auVar79;
              root.ptr = uVar61;
              lVar56 = lVar56 + 4;
            } while (lVar56 != 0);
            iVar54 = 4;
            if (root.ptr == 8) goto LAB_01f5a6ef;
            uVar20 = vcmpps_avx512vl(auVar75,local_5920,9);
            auVar190 = ZEXT3264(auVar75);
          } while ((byte)uVar62 < (byte)POPCOUNT((int)uVar20));
          *puVar63 = root.ptr;
          puVar63 = puVar63 + 1;
          *pauVar57 = auVar75;
          pauVar57 = pauVar57 + 1;
        }
        else {
          do {
            local_5d60 = auVar75;
            k = 0;
            for (uVar60 = uVar68; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar119 = ZEXT1664(auVar119._0_16_);
            auVar127 = ZEXT1664(auVar127._0_16_);
            auVar136 = ZEXT1664(auVar136._0_16_);
            auVar145 = ZEXT1664(auVar145._0_16_);
            auVar155 = ZEXT1664(auVar155._0_16_);
            auVar158 = ZEXT1664(auVar158._0_16_);
            auVar160 = ZEXT1664(auVar160._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar67 = occluded1(local_5c98,local_5ca0,root,k,&local_5d71,ray,
                               (TravRayK<8,_false> *)&local_5b20.field_0,context);
            bVar65 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar67) {
              bVar65 = 0;
            }
            bVar59 = bVar59 | bVar65;
            uVar68 = uVar68 - 1 & uVar68;
            auVar75 = local_5d60;
          } while (uVar68 != 0);
          if (bVar59 == 0xff) {
            iVar54 = 3;
          }
          else {
            auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_5920._0_4_ =
                 (uint)(bVar59 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * local_5920._0_4_;
            bVar67 = (bool)(bVar59 >> 1 & 1);
            local_5920._4_4_ = (uint)bVar67 * auVar75._4_4_ | (uint)!bVar67 * local_5920._4_4_;
            bVar67 = (bool)(bVar59 >> 2 & 1);
            local_5920._8_4_ = (uint)bVar67 * auVar75._8_4_ | (uint)!bVar67 * local_5920._8_4_;
            bVar67 = (bool)(bVar59 >> 3 & 1);
            local_5920._12_4_ = (uint)bVar67 * auVar75._12_4_ | (uint)!bVar67 * local_5920._12_4_;
            bVar67 = (bool)(bVar59 >> 4 & 1);
            local_5920._16_4_ = (uint)bVar67 * auVar75._16_4_ | (uint)!bVar67 * local_5920._16_4_;
            bVar67 = (bool)(bVar59 >> 5 & 1);
            local_5920._20_4_ = (uint)bVar67 * auVar75._20_4_ | (uint)!bVar67 * local_5920._20_4_;
            bVar67 = (bool)(bVar59 >> 6 & 1);
            local_5920._24_4_ = (uint)bVar67 * auVar75._24_4_ | (uint)!bVar67 * local_5920._24_4_;
            local_5920._28_4_ =
                 (uint)(bVar59 >> 7) * auVar75._28_4_ |
                 (uint)!(bool)(bVar59 >> 7) * local_5920._28_4_;
            iVar54 = 2;
          }
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar192 = ZEXT3264(auVar75);
          auVar190 = ZEXT3264(local_5d60);
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar191 = ZEXT3264(auVar75);
          auVar70 = vxorps_avx512vl(auVar193._0_16_,auVar193._0_16_);
          auVar193 = ZEXT1664(auVar70);
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar194 = ZEXT3264(auVar75);
          if (uVar62 < (uint)POPCOUNT(uVar66)) goto LAB_01f5a4f6;
        }
LAB_01f5a6ef:
      } while ((iVar54 == 4) || (iVar54 == 2));
LAB_01f5b248:
      bVar59 = bVar59 & (byte)local_5d64;
      bVar67 = (bool)(bVar59 >> 1 & 1);
      bVar8 = (bool)(bVar59 >> 2 & 1);
      bVar9 = (bool)(bVar59 >> 3 & 1);
      bVar10 = (bool)(bVar59 >> 4 & 1);
      bVar11 = (bool)(bVar59 >> 5 & 1);
      bVar12 = (bool)(bVar59 >> 6 & 1);
      *(uint *)local_5d28 =
           (uint)(bVar59 & 1) * -0x800000 | (uint)!(bool)(bVar59 & 1) * *(int *)local_5d28;
      *(uint *)(local_5d28 + 4) =
           (uint)bVar67 * -0x800000 | (uint)!bVar67 * *(int *)(local_5d28 + 4);
      *(uint *)(local_5d28 + 8) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5d28 + 8);
      *(uint *)(local_5d28 + 0xc) =
           (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5d28 + 0xc);
      *(uint *)(local_5d28 + 0x10) =
           (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5d28 + 0x10);
      *(uint *)(local_5d28 + 0x14) =
           (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5d28 + 0x14);
      *(uint *)(local_5d28 + 0x18) =
           (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_5d28 + 0x18);
      *(uint *)(local_5d28 + 0x1c) =
           (uint)(bVar59 >> 7) * -0x800000 |
           (uint)!(bool)(bVar59 >> 7) * *(int *)(local_5d28 + 0x1c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }